

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsip.cpp
# Opt level: O0

time_t __thiscall tsip::get_gps_time_utc(tsip *this)

{
  _command_packet _cmd;
  bool bVar1;
  time_t tVar2;
  long in_RDI;
  _command_packet in_stack_00000000;
  tm time;
  bool rc;
  tm local_d0;
  undefined1 local_98 [4];
  undefined4 uStack_94;
  undefined8 uStack_90;
  undefined8 local_88;
  tsip *in_stack_ffffffffffffff80;
  undefined8 local_78;
  undefined8 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  *(undefined1 *)(in_RDI + 0x578) = 0x8e;
  *(undefined1 *)(in_RDI + 0x579) = 0xa2;
  *(undefined1 *)(in_RDI + 0x57a) = 3;
  *(undefined1 *)(in_RDI + 0x5b8) = 3;
  memcpy(&stack0xffffffffffffffb0,(void *)(in_RDI + 0x578),0x44);
  send_request_msg((tsip *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                   in_stack_00000000);
  *(undefined1 *)(in_RDI + 0x578) = 0x8e;
  *(undefined1 *)(in_RDI + 0x579) = 0xab;
  *(undefined1 *)(in_RDI + 0x5b8) = 2;
  memcpy(local_98,(void *)(in_RDI + 0x578),0x44);
  _cmd._8_8_ = in_stack_ffffffffffffff98;
  _cmd._0_8_ = in_stack_ffffffffffffff90;
  _cmd._16_8_ = in_stack_ffffffffffffffa0;
  _cmd._24_4_ = in_stack_ffffffffffffffa8;
  _cmd._28_4_ = in_stack_ffffffffffffffac;
  _cmd._32_8_ = in_stack_ffffffffffffffb0;
  _cmd._40_8_ = in_stack_ffffffffffffffb8;
  _cmd._48_8_ = in_stack_ffffffffffffffc0;
  _cmd._56_8_ = in_stack_ffffffffffffffc8;
  _cmd._64_4_ = in_stack_ffffffffffffffd0;
  bVar1 = get_report_msg(in_stack_ffffffffffffff80,_cmd);
  if (!bVar1) {
    printf("****Failed to get GPS time****\n");
    exit(0);
  }
  local_d0.tm_zone = "UTC";
  local_d0.tm_wday = -1;
  local_d0.tm_yday = -1;
  local_d0.tm_isdst = -1;
  local_d0.tm_year = *(ushort *)(in_RDI + 0x11e) - 0x76c;
  local_d0.tm_mon = *(byte *)(in_RDI + 0x11d) - 1;
  local_d0.tm_mday = (int)*(byte *)(in_RDI + 0x11c);
  local_d0.tm_hour = (int)*(byte *)(in_RDI + 0x11b);
  local_d0.tm_min = (int)*(byte *)(in_RDI + 0x11a);
  local_d0.tm_sec = (int)*(byte *)(in_RDI + 0x119);
  tVar2 = timegm(&local_d0);
  *(time_t *)(in_RDI + 8) = tVar2;
  if ((*(byte *)(in_RDI + 0x9c0) & 1) != 0) {
    printf("Got GPS time Year: %d, Month: %d, Day: %d, Hour: %d, Minutes: %d, Seconds: %d\n",
           (ulong)(uint)local_d0.tm_year,(ulong)(uint)local_d0.tm_mon,(ulong)(uint)local_d0.tm_mday,
           (ulong)(uint)local_d0.tm_hour,(ulong)(uint)local_d0.tm_min,
           CONCAT44(uStack_94,local_d0.tm_sec),uStack_90,local_88,in_stack_ffffffffffffff80,local_78
           ,in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,
           in_stack_ffffffffffffffa8);
    printf("seconds: %d\n",*(undefined8 *)(in_RDI + 8));
  }
  return *(time_t *)(in_RDI + 8);
}

Assistant:

time_t tsip::get_gps_time_utc() {
	bool rc;

	//build a2 request - set UTC
	m_command.extended.code = COMMAND_SUPER_PACKET;
	m_command.extended.subcode = REPORT_SUPER_UTC_GPS_TIME;
	m_command.extended.data[0] = 0x3;
	m_command.extended.cmd_len = 3;

	rc = send_request_msg(m_command);

	//build ab request - request time packet
	m_command.extended.code = COMMAND_SUPER_PACKET;
	m_command.extended.subcode = REPORT_SUPER_PRIMARY_TIME;
	m_command.extended.cmd_len  = 2;
	rc = get_report_msg(m_command);
	if (!rc) {
		printf("****Failed to get GPS time****\n");
		exit (false);
    }


	struct tm time;

    time.tm_zone = "UTC";
    time.tm_wday = -1;
    time.tm_yday = -1;
    time.tm_isdst = -1;
    time.tm_year = m_primary_time.report.year - 1900;
    time.tm_mon = m_primary_time.report.month - 1;
    time.tm_mday = m_primary_time.report.day;
    time.tm_hour = m_primary_time.report.hours;
    time.tm_min = m_primary_time.report.minutes;
    time.tm_sec = m_primary_time.report.seconds;

    gps_time = timegm(&time);
    if (verbose) {
		printf("Got GPS time Year: %d, Month: %d, Day: %d, Hour: %d, Minutes: %d, Seconds: %d\n", time.tm_year, time.tm_mon, time.tm_mday, time.tm_hour, time.tm_min, time.tm_sec);
		printf("seconds: %d\n", gps_time);
    }

	return gps_time;
}